

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

void rune_xtra_act(keypress ch,wchar_t oid)

{
  uint32_t *puVar1;
  _Bool _Var2;
  quark_t qVar3;
  char *pcVar4;
  size_t i;
  char note_text [80];
  char local_68 [88];
  
  if (ch._0_8_ >> 0x20 == 0x7b) {
    local_68[0x40] = '\0';
    local_68[0x41] = '\0';
    local_68[0x42] = '\0';
    local_68[0x43] = '\0';
    local_68[0x44] = '\0';
    local_68[0x45] = '\0';
    local_68[0x46] = '\0';
    local_68[0x47] = '\0';
    local_68[0x48] = '\0';
    local_68[0x49] = '\0';
    local_68[0x4a] = '\0';
    local_68[0x4b] = '\0';
    local_68[0x4c] = '\0';
    local_68[0x4d] = '\0';
    local_68[0x4e] = '\0';
    local_68[0x4f] = '\0';
    local_68[0x30] = '\0';
    local_68[0x31] = '\0';
    local_68[0x32] = '\0';
    local_68[0x33] = '\0';
    local_68[0x34] = '\0';
    local_68[0x35] = '\0';
    local_68[0x36] = '\0';
    local_68[0x37] = '\0';
    local_68[0x38] = '\0';
    local_68[0x39] = '\0';
    local_68[0x3a] = '\0';
    local_68[0x3b] = '\0';
    local_68[0x3c] = '\0';
    local_68[0x3d] = '\0';
    local_68[0x3e] = '\0';
    local_68[0x3f] = '\0';
    local_68[0x20] = '\0';
    local_68[0x21] = '\0';
    local_68[0x22] = '\0';
    local_68[0x23] = '\0';
    local_68[0x24] = '\0';
    local_68[0x25] = '\0';
    local_68[0x26] = '\0';
    local_68[0x27] = '\0';
    local_68[0x28] = '\0';
    local_68[0x29] = '\0';
    local_68[0x2a] = '\0';
    local_68[0x2b] = '\0';
    local_68[0x2c] = '\0';
    local_68[0x2d] = '\0';
    local_68[0x2e] = '\0';
    local_68[0x2f] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    local_68[0x18] = '\0';
    local_68[0x19] = '\0';
    local_68[0x1a] = '\0';
    local_68[0x1b] = '\0';
    local_68[0x1c] = '\0';
    local_68[0x1d] = '\0';
    local_68[0x1e] = '\0';
    local_68[0x1f] = '\0';
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    screen_save();
    prt("Inscribe with: ",L'\0',L'\0');
    i = (size_t)oid;
    qVar3 = rune_note(i);
    if (qVar3 != 0) {
      qVar3 = rune_note(i);
      pcVar4 = quark_str(qVar3);
      strnfmt(local_68,0x50,"%s",pcVar4);
    }
    _Var2 = askfor_aux(local_68,0x50,
                       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
    if (_Var2) {
      qVar3 = rune_note(i);
      if (qVar3 != 0) {
        rune_set_note(i,(char *)0x0);
      }
      rune_set_note(i,local_68);
      rune_autoinscribe(player,oid);
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x60000;
    }
    screen_load();
  }
  else if (ch.code == 0x7d) {
    rune_set_note((long)oid,(char *)0x0);
    return;
  }
  return;
}

Assistant:

static void rune_xtra_act(struct keypress ch, int oid)
{
	/* Uninscribe */
	if (ch.code == '}') {
		rune_set_note(oid, NULL);
	} else if (ch.code == '{') {
		/* Inscribe */
		char note_text[80] = "";

		/* Avoid the prompt getting in the way */
		screen_save();

		/* Prompt */
		prt("Inscribe with: ", 0, 0);

		/* Default note */
		if (rune_note(oid))
			strnfmt(note_text, sizeof(note_text), "%s",
					quark_str(rune_note(oid)));

		/* Get an inscription */
		if (askfor_aux(note_text, sizeof(note_text), NULL)) {
			/* Remove old inscription if existent */
			if (rune_note(oid))
				rune_set_note(oid, NULL);

			/* Add the autoinscription */
			rune_set_note(oid, note_text);
			rune_autoinscribe(player, oid);

			/* Redraw gear */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
		}

		/* Reload the screen */
		screen_load();
	}
}